

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_schema.c
# Opt level: O2

ssize_t tnt_get_space(tnt_stream *s)

{
  tnt_stream *s_00;
  ssize_t sVar1;
  
  s_00 = tnt_object((tnt_stream *)0x0);
  if (s_00 == (tnt_stream *)0x0) {
    sVar1 = -1;
  }
  else {
    tnt_object_add_array(s_00,0);
    sVar1 = tnt_select(s,0x119,2,0xffffffff,0,'\x02',s_00);
    tnt_stream_free(s_00);
  }
  return sVar1;
}

Assistant:

ssize_t
tnt_get_space(struct tnt_stream *s)
{
	struct tnt_stream *obj = tnt_object(NULL);
	if (obj == NULL)
		return -1;

	tnt_object_add_array(obj, 0);
	ssize_t retval = tnt_select(s, tnt_vsp_space, tnt_vin_name,
				    UINT32_MAX, 0, TNT_ITER_ALL, obj);
	tnt_stream_free(obj);
	return retval;
}